

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O1

void accumulate(vw *all,parameters *weights,size_t offset)

{
  float fVar1;
  uint32_t uVar2;
  uint64_t i_2;
  float *buffer;
  weight *pwVar3;
  byte bVar4;
  uint64_t i_1;
  ulong uVar5;
  uint64_t i;
  size_t sVar6;
  size_t n;
  
  bVar4 = (byte)all->num_bits;
  n = 1L << (bVar4 & 0x3f);
  uVar5 = 0xffffffffffffffff;
  if (all->num_bits < 0x3e) {
    uVar5 = 4L << (bVar4 & 0x3f);
  }
  buffer = (float *)operator_new__(uVar5);
  if (weights->sparse == false) {
    uVar2 = (weights->dense_weights)._stride_shift;
    uVar5 = (weights->dense_weights)._weight_mask;
    pwVar3 = (weights->dense_weights)._begin;
    sVar6 = 0;
    do {
      buffer[sVar6] = pwVar3[offset + (sVar6 << ((byte)uVar2 & 0x3f) & uVar5)];
      sVar6 = sVar6 + 1;
    } while (n != sVar6);
  }
  else {
    sVar6 = 0;
    do {
      pwVar3 = sparse_parameters::operator[]
                         (&weights->sparse_weights,
                          sVar6 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
      buffer[sVar6] = pwVar3[offset];
      sVar6 = sVar6 + 1;
    } while (n != sVar6);
  }
  all_reduce<float,_&add_float>(all,buffer,n);
  if (weights->sparse == false) {
    sVar6 = 0;
    do {
      (weights->dense_weights)._begin
      [(sVar6 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
       (weights->dense_weights)._weight_mask) + offset] = buffer[sVar6];
      sVar6 = sVar6 + 1;
    } while (n != sVar6);
  }
  else {
    sVar6 = 0;
    do {
      fVar1 = buffer[sVar6];
      pwVar3 = sparse_parameters::operator[]
                         (&weights->sparse_weights,
                          sVar6 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
      pwVar3[offset] = fVar1;
      sVar6 = sVar6 + 1;
    } while (n != sVar6);
  }
  operator_delete__(buffer);
  return;
}

Assistant:

void accumulate(vw& all, parameters& weights, size_t offset)
{
  uint64_t length = UINT64_ONE << all.num_bits;  // This is size of gradient
  float* local_grad = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset];
  else
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset];

  all_reduce<float, add_float>(all, local_grad, length);  // TODO: modify to not use first()

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset] = local_grad[i];
  else
    for (uint64_t i = 0; i < length; i++)
      (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset] = local_grad[i];

  delete[] local_grad;
}